

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O2

void __thiscall Simulator::pop_identity(Simulator *this,PCode *code)

{
  Symbol *pSVar1;
  simulator_error *psVar2;
  _Elt_pointer pSVar3;
  allocator local_8d;
  int local_8c;
  string local_88;
  StackSymbol back;
  
  pSVar3 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar3 == (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pSVar3 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 7;
  }
  StackSymbol::StackSymbol(&back,pSVar3 + -1);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(&this->stack_);
  pSVar1 = ScopeTree::resolve(&this->tree_,&code->first_);
  if (pSVar1->type_ == kReal) {
    if (back.type_ != kReal) {
      if (back.type_ != kInt) {
        psVar2 = (simulator_error *)__cxa_allocate_exception(0x30);
        local_8c = this->eip_;
        std::__cxx11::string::string((string *)&local_88,anon_var_dwarf_acda,&local_8d);
        simulator_error::simulator_error(psVar2,&local_8c,&local_88);
        __cxa_throw(psVar2,&simulator_error::typeinfo,simulator_error::~simulator_error);
      }
      back.value_.real_value = (double)back.value_.int_value;
    }
    (pSVar1->value_).real_value = back.value_.real_value;
  }
  else {
    if (pSVar1->type_ != kInt) {
      psVar2 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_8c = this->eip_;
      std::__cxx11::string::string((string *)&local_88,anon_var_dwarf_acf4,&local_8d);
      simulator_error::simulator_error(psVar2,&local_8c,&local_88);
      __cxa_throw(psVar2,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    if (back.type_ == kReal) {
      back.value_.int_value = (int)back.value_.real_value;
    }
    else if (back.type_ != kInt) {
      psVar2 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_8c = this->eip_;
      std::__cxx11::string::string((string *)&local_88,anon_var_dwarf_acda,&local_8d);
      simulator_error::simulator_error(psVar2,&local_8c,&local_88);
      __cxa_throw(psVar2,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    (pSVar1->value_).int_value = back.value_.int_value;
  }
  pSVar1->is_assigned_ = true;
  this->eip_ = this->eip_ + 1;
  StackSymbol::UnionValue::~UnionValue(&back.value_);
  return;
}

Assistant:

void Simulator::pop_identity(const PCode &code) {
    StackSymbol back = stack_.back();
    stack_.pop_back();
    Symbol &symbol = tree_.resolve(code.first());

    if (symbol.type() == Symbol::Type::kInt) {
        if (back.type() == StackSymbol::Type::kInt) {
            symbol.set_value((int) back.int_value());
        } else if (back.type() == StackSymbol::Type::kReal) {
            symbol.set_value((int) back.real_value());
        } else {
            throw simulator_error(eip(), "无法取出栈顶元素");
        }
    } else if (symbol.type() == Symbol::Type::kReal) {
        if (back.type() == StackSymbol::Type::kInt) {
            symbol.set_value((double) back.int_value());
        } else if (back.type() == StackSymbol::Type::kReal) {
            symbol.set_value((double) back.real_value());
        } else {
            throw simulator_error(eip(), "无法取出栈顶元素");
        }
    } else {
        throw simulator_error(eip(), "错误的目标类型");
    }

    symbol.set_assigned();

    inc_eip();
}